

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O2

void __thiscall duckdb::ValidityMask::Read(ValidityMask *this,ReadStream *reader,idx_t count)

{
  ValiditySerialization VVar1;
  unsigned_short uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  TemplatedValidityMask<unsigned_long>::Initialize
            (&this->super_TemplatedValidityMask<unsigned_long>,count);
  VVar1 = ReadStream::Read<duckdb::ValiditySerialization>(reader);
  if (VVar1 != BITMASK) {
    uVar3 = ReadStream::Read<unsigned_int>(reader);
    if (VVar1 == VALID_VALUES) {
      TemplatedValidityMask<unsigned_long>::SetAllInvalid
                (&this->super_TemplatedValidityMask<unsigned_long>,count);
    }
    uVar4 = (ulong)uVar3;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      if (count < 0xffff) {
        uVar2 = ReadStream::Read<unsigned_short>(reader);
        uVar3 = (uint)uVar2;
      }
      else {
        uVar3 = ReadStream::Read<unsigned_int>(reader);
      }
      TemplatedValidityMask<unsigned_long>::Set
                (&this->super_TemplatedValidityMask<unsigned_long>,(ulong)uVar3,
                 VVar1 == VALID_VALUES);
    }
    return;
  }
  (**reader->_vptr_ReadStream)
            (reader,(this->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             count + 0x3f >> 3 & 0xfffffffffffffff8);
  return;
}

Assistant:

void ValidityMask::Read(ReadStream &reader, idx_t count) {
	Initialize(count);
	// deserialize the storage type
	auto flag = reader.Read<ValiditySerialization>();
	if (flag == ValiditySerialization::BITMASK) {
		// deserialize the bitmask
		reader.ReadData(data_ptr_cast(GetData()), ValidityMask::ValidityMaskSize(count));
		return;
	}
	auto is_u32 = count >= NumericLimits<uint16_t>::Maximum();
	auto is_valid = flag == ValiditySerialization::VALID_VALUES;
	auto serialize_count = reader.Read<uint32_t>();
	if (is_valid) {
		SetAllInvalid(count);
	}
	for (idx_t i = 0; i < serialize_count; i++) {
		idx_t index = is_u32 ? reader.Read<uint32_t>() : reader.Read<uint16_t>();
		Set(index, is_valid);
	}
}